

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void next_field(char **p,char **start,char **end,char *sep)

{
  bool bVar1;
  char *sep_local;
  char **end_local;
  char **start_local;
  char **p_local;
  
  while( true ) {
    bVar1 = true;
    if ((**p != ' ') && (bVar1 = true, **p != '\t')) {
      bVar1 = **p == '\n';
    }
    if (!bVar1) break;
    *p = *p + 1;
  }
  *start = *p;
  while( true ) {
    bVar1 = false;
    if ((((**p != '\0') && (bVar1 = false, **p != ',')) && (bVar1 = false, **p != ':')) &&
       (bVar1 = false, **p != '\n')) {
      bVar1 = **p != '#';
    }
    if (!bVar1) break;
    *p = *p + 1;
  }
  *sep = **p;
  if (*p == *start) {
    *end = *p;
  }
  else {
    *end = *p + -1;
    while( true ) {
      bVar1 = true;
      if ((**end != ' ') && (bVar1 = true, **end != '\t')) {
        bVar1 = **end == '\n';
      }
      if (!bVar1) break;
      *end = *end + -1;
    }
    *end = *end + 1;
  }
  if (*sep == '#') {
    while( true ) {
      bVar1 = false;
      if ((**p != '\0') && (bVar1 = false, **p != ',')) {
        bVar1 = **p != '\n';
      }
      if (!bVar1) break;
      *p = *p + 1;
    }
    *sep = **p;
  }
  if (**p != '\0') {
    *p = *p + 1;
  }
  return;
}

Assistant:

static void
next_field(const char **p, const char **start,
    const char **end, char *sep)
{
	/* Skip leading whitespace to find start of field. */
	while (**p == ' ' || **p == '\t' || **p == '\n') {
		(*p)++;
	}
	*start = *p;

	/* Scan for the separator. */
	while (**p != '\0' && **p != ',' && **p != ':' && **p != '\n' &&
	    **p != '#') {
		(*p)++;
	}
	*sep = **p;

	/* Locate end of field, trim trailing whitespace if necessary */
	if (*p == *start) {
		*end = *p;
	} else {
		*end = *p - 1;
		while (**end == ' ' || **end == '\t' || **end == '\n') {
			(*end)--;
		}
		(*end)++;
	}

	/* Handle in-field comments */
	if (*sep == '#') {
		while (**p != '\0' && **p != ',' && **p != '\n') {
			(*p)++;
		}
		*sep = **p;
	}

	/* Adjust scanner location. */
	if (**p != '\0')
		(*p)++;
}